

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void rmdir_cb(uv_fs_t *req)

{
  int iVar1;
  uv_fs_t *req_local;
  
  if (req != &rmdir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x243,"req == &rmdir_req");
    abort();
  }
  if (rmdir_req.fs_type != UV_FS_RMDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x244,"req->fs_type == UV_FS_RMDIR");
    abort();
  }
  if (rmdir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x245,"req->result == 0");
    abort();
  }
  rmdir_cb_count = rmdir_cb_count + 1;
  if (rmdir_req.path == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x247,"req->path");
    abort();
  }
  iVar1 = memcmp(rmdir_req.path,"test_dir",9);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x248,"memcmp(req->path, \"test_dir\\0\", 9) == 0");
    abort();
  }
  uv_fs_req_cleanup(&rmdir_req);
  return;
}

Assistant:

static void rmdir_cb(uv_fs_t* req) {
  ASSERT(req == &rmdir_req);
  ASSERT(req->fs_type == UV_FS_RMDIR);
  ASSERT(req->result == 0);
  rmdir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
}